

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInAlsa::closePort(MidiInAlsa *this)

{
  undefined8 *puVar1;
  int iVar2;
  int res;
  AlsaMidiData *data;
  MidiInAlsa *this_local;
  
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if (((this->super_MidiInApi).super_MidiApi.connected_ & 1U) != 0) {
    if (puVar1[2] != 0) {
      snd_seq_unsubscribe_port(*puVar1,puVar1[2]);
      snd_seq_port_subscribe_free(puVar1[2]);
      puVar1[2] = 0;
    }
    snd_seq_control_queue(*puVar1,*(undefined4 *)(puVar1 + 9),0x20,0,0);
    snd_seq_drain_output(*puVar1);
    (this->super_MidiInApi).super_MidiApi.connected_ = false;
  }
  if (((this->super_MidiInApi).inputData_.doInput & 1U) != 0) {
    (this->super_MidiInApi).inputData_.doInput = false;
    write(*(int *)(puVar1 + 10),&(this->super_MidiInApi).inputData_.doInput,1);
    iVar2 = pthread_equal(puVar1[6],puVar1[7]);
    if (iVar2 == 0) {
      pthread_join(puVar1[6],(void **)0x0);
    }
  }
  return;
}

Assistant:

void MidiInAlsa :: closePort( void )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);

  if ( connected_ ) {
    if ( data->subscription ) {
      snd_seq_unsubscribe_port( data->seq, data->subscription );
      snd_seq_port_subscribe_free( data->subscription );
      data->subscription = 0;
    }
    // Stop the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_stop_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    connected_ = false;
  }

  // Stop thread to avoid triggering the callback, while the port is intended to be closed
  if ( inputData_.doInput ) {
    inputData_.doInput = false;
    int res = write( data->trigger_fds[1], &inputData_.doInput, sizeof( inputData_.doInput ) );
    (void) res;
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );
  }
}